

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_v2.cpp
# Opt level: O2

MPP_RET mpp_enc_stop_v2(MppEnc ctx)

{
  MppThread *this;
  
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p in\n","mpp_enc_stop_v2",ctx);
  }
  if (*(MppThread **)((long)ctx + 0x68) != (MppThread *)0x0) {
    MppThread::stop(*(MppThread **)((long)ctx + 0x68));
    this = *(MppThread **)((long)ctx + 0x68);
    if (this != (MppThread *)0x0) {
      MppThread::~MppThread(this);
    }
    operator_delete(this,0x198);
    *(undefined8 *)((long)ctx + 0x68) = 0;
  }
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p out\n","mpp_enc_stop_v2",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_stop_v2(MppEnc ctx)
{
    MPP_RET ret = MPP_OK;
    MppEncImpl *enc = (MppEncImpl *)ctx;

    enc_dbg_func("%p in\n", enc);

    if (enc->thread_enc) {
        enc->thread_enc->stop();
        delete enc->thread_enc;
        enc->thread_enc = NULL;
    }

    enc_dbg_func("%p out\n", enc);
    return ret;

}